

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O1

socket_t net_accept(socket_t listenfd,sockaddr_in *addr)

{
  int __fd;
  uint uVar1;
  uint len;
  int enable;
  socklen_t local_10 [2];
  
  local_10[0] = 0x10;
  __fd = accept(listenfd,(sockaddr *)addr,local_10);
  if (__fd < 0) {
    __fd = -1;
  }
  else {
    uVar1 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    local_10[1] = 1;
    setsockopt(__fd,6,1,local_10 + 1,4);
  }
  return __fd;
}

Assistant:

socket_t net_accept(socket_t listenfd, sockaddr_in& addr)
{
#if defined(__linux__) || defined(__APPLE__)
    unsigned int len = sizeof (struct sockaddr_in);
#else
    int len = sizeof (struct sockaddr_in);
#endif

    socket_t fd = ::accept(listenfd, (struct sockaddr*)&addr, &len);
    if (fd < 0)
    {
        return -1;
    }

    set_no_block(fd);
    set_no_delay(fd);
    return fd;
}